

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O0

void __thiscall SocketReceiveMultiplexer::Implementation::~Implementation(Implementation *this)

{
  Implementation *this_local;
  
  close(this->breakPipe_[0]);
  close(this->breakPipe_[1]);
  std::vector<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>::~vector
            (&this->timerListeners_);
  std::
  vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
  ::~vector(&this->socketListeners_);
  return;
}

Assistant:

~Implementation()
	{
		close( breakPipe_[0] );
		close( breakPipe_[1] );
	}